

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

bool __thiscall Pathie::Path::is_root(Path *this)

{
  if ((this->m_path)._M_string_length == 1) {
    return *(this->m_path)._M_dataplus._M_p == '/';
  }
  return false;
}

Assistant:

bool Path::is_root() const
{
#if defined(_PATHIE_UNIX)
  return m_path.length() == 1 && m_path[0] == '/';
#elif defined(_WIN32)
  // / on Windows is root on current drive
  if (m_path.length() == 1 && m_path[0] == '/')
    return true;

  // X:/ is root including drive letter
  return m_path.length() == 3 && m_path[1] == ':';
#else
#error Unsupported platform.
#endif
}